

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O2

int main_body<dynet::GRUBuilder>(variables_map *vm)

{
  variables_map *this;
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer ptVar4;
  pointer ptVar5;
  __pid_t _Var6;
  size_type sVar7;
  any *paVar8;
  uint *puVar9;
  size_type sVar10;
  size_type sVar11;
  ostream *poVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  AdamTrainer *this_00;
  float *pfVar14;
  Trainer *pTVar15;
  void *pvVar16;
  int *piVar17;
  string *this_01;
  key_type *this_02;
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int> *sent;
  pointer ptVar18;
  pointer ptVar19;
  bool bVar20;
  bool local_694;
  bool local_693;
  allocator local_692;
  allocator local_691;
  key_type local_690;
  size_type local_670;
  allocator local_662;
  allocator local_661;
  size_type local_660;
  key_type local_658;
  ulong local_638;
  Model model;
  Corpus devel;
  string fname;
  key_type local_568;
  Corpus testing;
  Corpus training;
  key_type local_510;
  string flavour;
  AttentionalModel<dynet::GRUBuilder> am;
  string local_b0;
  string local_90;
  string local_70;
  string line;
  
  std::__cxx11::string::string((string *)&am,"<s>",(allocator *)&model);
  kSRC_SOS = dynet::Dict::convert(&sd,(string *)&am);
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"</s>",(allocator *)&model);
  kSRC_EOS = dynet::Dict::convert(&sd,(string *)&am);
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"<s>",(allocator *)&model);
  kTGT_SOS = dynet::Dict::convert(&td,(string *)&am);
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"</s>",(allocator *)&model);
  kTGT_EOS = dynet::Dict::convert(&td,(string *)&am);
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"verbose",(allocator *)&model);
  this = vm + 0x10;
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  verbose = sVar7 != 0;
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"layers",(allocator *)&model);
  paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar9 = (uint *)boost::any_cast<int_const&>(paVar8);
  LAYERS = *puVar9;
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"align",(allocator *)&model);
  paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar9 = (uint *)boost::any_cast<int_const&>(paVar8);
  ALIGN_DIM = *puVar9;
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"hidden",(allocator *)&model);
  paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar9 = (uint *)boost::any_cast<int_const&>(paVar8);
  HIDDEN_DIM = *puVar9;
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"bidirectional",(allocator *)&model);
  local_660 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)this,(key_type *)&am);
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"giza",(allocator *)&model);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  std::__cxx11::string::~string((string *)&am);
  local_694 = true;
  local_638._0_1_ = 1;
  local_693 = true;
  if (sVar7 == 0) {
    std::__cxx11::string::string((string *)&am,"gz-position",(allocator *)&model);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&am);
    local_638._0_1_ = sVar7 != 0;
    std::__cxx11::string::~string((string *)&am);
    std::__cxx11::string::string((string *)&am,"gz-markov",(allocator *)&model);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&am);
    local_693 = sVar7 != 0;
    std::__cxx11::string::~string((string *)&am);
    std::__cxx11::string::string((string *)&am,"gz-fertility",(allocator *)&model);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,(key_type *)&am);
    local_694 = sVar7 != 0;
    std::__cxx11::string::~string((string *)&am);
  }
  std::__cxx11::string::string((string *)&am,"fertility",(allocator *)&model);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)this,(key_type *)&am);
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"swap",(allocator *)&model);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)this,(key_type *)&am);
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"document",(allocator *)&model);
  local_670 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)this,(key_type *)&am);
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&flavour,"RNN",(allocator *)&am);
  std::__cxx11::string::string((string *)&am,"lstm",(allocator *)&model);
  sVar11 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)this,(key_type *)&am);
  std::__cxx11::string::~string((string *)&am);
  if (sVar11 == 0) {
    std::__cxx11::string::string((string *)&am,"gru",(allocator *)&model);
    sVar11 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,(key_type *)&am);
    std::__cxx11::string::~string((string *)&am);
    if (sVar11 != 0) goto LAB_00131a73;
  }
  else {
LAB_00131a73:
    std::__cxx11::string::assign((char *)&flavour);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  training.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  devel.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  testing.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_string_length = 0;
  training.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  training.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  devel.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  devel.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  testing.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testing.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  poVar12 = std::operator<<((ostream *)&std::cerr,"Reading training data from ");
  std::__cxx11::string::string((string *)&am,"train",(allocator *)&model);
  paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar8);
  poVar12 = std::operator<<(poVar12,(string *)pbVar13);
  std::operator<<(poVar12,"...\n");
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"train",(allocator *)&fname);
  paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar8);
  read_corpus((Corpus *)&model,pbVar13,local_670 != 0);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::_M_move_assign(&training,&model);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             *)&model);
  std::__cxx11::string::~string((string *)&am);
  sd.frozen = true;
  td.frozen = true;
  SRC_VOCAB_SIZE =
       (uint)((ulong)((long)sd.words_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)sd.words_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  TGT_VOCAB_SIZE =
       (uint)((ulong)((long)td.words_.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)td.words_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  std::__cxx11::string::string((string *)&am,"devel",(allocator *)&model);
  sVar11 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)this,(key_type *)&am);
  std::__cxx11::string::~string((string *)&am);
  if (sVar11 != 0) {
    poVar12 = std::operator<<((ostream *)&std::cerr,"Reading dev data from ");
    std::__cxx11::string::string((string *)&am,"devel",(allocator *)&model);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar8);
    poVar12 = std::operator<<(poVar12,(string *)pbVar13);
    std::operator<<(poVar12,"...\n");
    std::__cxx11::string::~string((string *)&am);
    std::__cxx11::string::string((string *)&am,"devel",(allocator *)&fname);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar8);
    read_corpus((Corpus *)&model,pbVar13,local_670 != 0);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::_M_move_assign(&devel,&model);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)&model);
    std::__cxx11::string::~string((string *)&am);
  }
  std::__cxx11::string::string((string *)&am,"test",(allocator *)&fname);
  sVar11 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)this,(key_type *)&am);
  if (sVar11 == 0) {
LAB_00131e5a:
    std::__cxx11::string::~string((string *)&am);
  }
  else {
    std::__cxx11::string::string((string *)&model,"rescore",(allocator *)&local_690);
    sVar11 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,(key_type *)&model);
    std::__cxx11::string::~string((string *)&model);
    std::__cxx11::string::~string((string *)&am);
    if (sVar11 != 0) {
      poVar12 = std::operator<<((ostream *)&std::cerr,"Reading test examples from ");
      std::__cxx11::string::string((string *)&am,"test",(allocator *)&model);
      paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar8);
      poVar12 = std::operator<<(poVar12,(string *)pbVar13);
      std::endl<char,std::char_traits<char>>(poVar12);
      std::__cxx11::string::~string((string *)&am);
      std::__cxx11::string::string((string *)&am,"test",(allocator *)&fname);
      paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar8);
      read_corpus((Corpus *)&model,pbVar13,local_670 != 0);
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::_M_move_assign(&testing,&model);
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 *)&model);
      goto LAB_00131e5a;
    }
  }
  if (sVar10 != 0) {
    std::operator<<((ostream *)&std::cerr,"Swapping role of source and target\n");
    std::swap<dynet::Dict>(&sd,&td);
    ptVar5 = training.
             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar3 = kTGT_EOS;
    iVar2 = kTGT_SOS;
    uVar1 = TGT_VOCAB_SIZE;
    kTGT_SOS = kSRC_SOS;
    kSRC_SOS = iVar2;
    kTGT_EOS = kSRC_EOS;
    kSRC_EOS = iVar3;
    TGT_VOCAB_SIZE = SRC_VOCAB_SIZE;
    SRC_VOCAB_SIZE = uVar1;
    for (ptVar19 = training.
                   super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ptVar4 = devel.
                 super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        ptVar18 = devel.
                  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, ptVar19 != ptVar5;
        ptVar19 = ptVar19 + 1) {
      std::_Vector_base<int,_std::allocator<int>_>::_Vector_impl_data::_M_swap_data
                ((_Vector_impl_data *)
                 &(ptVar19->
                  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>,
                 (_Vector_impl_data *)
                 &(ptVar19->
                  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                  super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>);
    }
    for (; ptVar5 = testing.
                    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        ptVar19 = testing.
                  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, ptVar18 != ptVar4;
        ptVar18 = ptVar18 + 1) {
      std::_Vector_base<int,_std::allocator<int>_>::_Vector_impl_data::_M_swap_data
                ((_Vector_impl_data *)
                 &(ptVar18->
                  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>,
                 (_Vector_impl_data *)
                 &(ptVar18->
                  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                  super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>);
    }
    for (; ptVar19 != ptVar5; ptVar19 = ptVar19 + 1) {
      std::_Vector_base<int,_std::allocator<int>_>::_Vector_impl_data::_M_swap_data
                ((_Vector_impl_data *)
                 &(ptVar19->
                  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  ).super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>,
                 (_Vector_impl_data *)
                 &(ptVar19->
                  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  ).super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                  super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>);
    }
  }
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&am,"parameters",(allocator *)&model);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)this,(key_type *)&am);
  std::__cxx11::string::~string((string *)&am);
  bVar20 = (bool)(undefined1)local_638;
  local_638 = (ulong)local_693;
  if (sVar10 == 0) {
    std::__cxx11::string::string((string *)&am,"initialise",(allocator *)&model);
    sVar10 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,(key_type *)&am);
    std::__cxx11::string::~string((string *)&am);
    if (sVar10 != 0) {
      std::__cxx11::string::string((string *)&am,"initialise",(allocator *)&model);
      paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      boost::any_cast<std::__cxx11::string_const&>(paVar8);
      std::__cxx11::string::_M_assign((string *)&fname);
      goto LAB_00132081;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&am);
    poVar12 = std::operator<<((ostream *)&am,"am");
    poVar12 = std::operator<<(poVar12,'_');
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,'_');
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,'_');
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12,'_');
    poVar12 = std::operator<<(poVar12,(string *)&flavour);
    poVar12 = std::operator<<(poVar12,"_b");
    poVar12 = std::ostream::_M_insert<bool>(SUB81(poVar12,0));
    poVar12 = std::operator<<(poVar12,"_g");
    pvVar16 = (void *)std::ostream::operator<<(poVar12,(uint)bVar20);
    pvVar16 = (void *)std::ostream::operator<<(pvVar16,(int)local_638);
    poVar12 = (ostream *)std::ostream::operator<<(pvVar16,(uint)local_694);
    poVar12 = std::operator<<(poVar12,"_d");
    poVar12 = std::ostream::_M_insert<bool>(SUB81(poVar12,0));
    poVar12 = std::operator<<(poVar12,"-pid");
    _Var6 = getpid();
    poVar12 = (ostream *)std::ostream::operator<<(poVar12,_Var6);
    std::operator<<(poVar12,".params");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&fname,(string *)&model);
    std::__cxx11::string::~string((string *)&model);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&am);
  }
  else {
    std::__cxx11::string::string((string *)&am,"parameters",(allocator *)&model);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    boost::any_cast<std::__cxx11::string_const&>(paVar8);
    std::__cxx11::string::_M_assign((string *)&fname);
LAB_00132081:
    std::__cxx11::string::~string((string *)&am);
  }
  poVar12 = std::operator<<((ostream *)&std::cerr,"Parameters will be written to: ");
  poVar12 = std::operator<<(poVar12,(string *)&fname);
  std::endl<char,std::char_traits<char>>(poVar12);
  dynet::Model::Model(&model);
  std::__cxx11::string::string((string *)&am,"sgd_trainer",(allocator *)&local_690);
  paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  puVar9 = boost::any_cast<unsigned_int_const&>(paVar8);
  uVar1 = *puVar9;
  std::__cxx11::string::~string((string *)&am);
  switch(uVar1) {
  case 0:
    this_00 = (AdamTrainer *)operator_new(0x40);
    std::__cxx11::string::string((string *)&am,"lr_eta",(allocator *)&local_690);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar14 = boost::any_cast<float_const&>(paVar8);
    dynet::SimpleSGDTrainer::SimpleSGDTrainer((SimpleSGDTrainer *)this_00,&model,*pfVar14,0.0);
    break;
  case 1:
    this_00 = (AdamTrainer *)operator_new(0x78);
    std::__cxx11::string::string((string *)&am,"lr_eta",(allocator *)&local_690);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar14 = boost::any_cast<float_const&>(paVar8);
    dynet::MomentumSGDTrainer::MomentumSGDTrainer
              ((MomentumSGDTrainer *)this_00,&model,*pfVar14,0.9,0.0);
    break;
  case 2:
    this_00 = (AdamTrainer *)operator_new(0x78);
    std::__cxx11::string::string((string *)&am,"lr_eta",(allocator *)&local_690);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar14 = boost::any_cast<float_const&>(paVar8);
    dynet::AdagradTrainer::AdagradTrainer((AdagradTrainer *)this_00,&model,*pfVar14,1e-20,0.0);
    break;
  case 3:
    this_00 = (AdamTrainer *)operator_new(0xa8);
    dynet::AdadeltaTrainer::AdadeltaTrainer((AdadeltaTrainer *)this_00,&model,1e-06,0.95,0.0);
    goto LAB_001322dc;
  case 4:
    this_00 = (AdamTrainer *)operator_new(0xb0);
    std::__cxx11::string::string((string *)&am,"lr_eta",(allocator *)&local_690);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar14 = boost::any_cast<float_const&>(paVar8);
    dynet::AdamTrainer::AdamTrainer(this_00,&model,*pfVar14,0.9,0.999,1e-08,0.0);
    break;
  default:
    this_00 = (AdamTrainer *)0x0;
    goto LAB_001322dc;
  }
  std::__cxx11::string::~string((string *)&am);
LAB_001322dc:
  std::__cxx11::string::string((string *)&am,"lr_eta_decay",(allocator *)&local_690);
  paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pfVar14 = boost::any_cast<float_const&>(paVar8);
  *(float *)((Trainer *)this_00 + 0x10) = *pfVar14;
  std::__cxx11::string::~string((string *)&am);
  std::__cxx11::string::string((string *)&am,"sparse_updates",(allocator *)&local_690);
  paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
  pTVar15 = (Trainer *)boost::any_cast<bool_const&>(paVar8);
  ((Trainer *)this_00)[0x30] = *pTVar15;
  std::__cxx11::string::~string((string *)&am);
  if (((Trainer *)this_00)[0x30] == (Trainer)0x0) {
    poVar12 = std::operator<<((ostream *)&std::cerr,
                              "Sparse updates for lookup parameter(s) to be disabled!");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  poVar12 = std::operator<<((ostream *)&std::cerr,"%% Using ");
  poVar12 = std::operator<<(poVar12,(string *)&flavour);
  poVar12 = std::operator<<(poVar12," recurrent units");
  std::endl<char,std::char_traits<char>>(poVar12);
  dynet::AttentionalModel<dynet::GRUBuilder>::AttentionalModel
            (&am,&model,SRC_VOCAB_SIZE,TGT_VOCAB_SIZE,LAYERS,HIDDEN_DIM,ALIGN_DIM,local_660 != 0,
             bVar20,SUB81(local_638,0),local_694,local_670 != 0,sVar7 == 0);
  std::__cxx11::string::string((string *)&local_690,"test",(allocator *)&local_568);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)this,&local_690);
  if (sVar10 == 0) {
    bVar20 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_658,"rescore",(allocator *)&local_510);
    sVar10 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,&local_658);
    bVar20 = sVar10 != 0;
    std::__cxx11::string::~string((string *)&local_658);
  }
  std::__cxx11::string::~string((string *)&local_690);
  if (bVar20) {
    dynet::AttentionalModel<dynet::GRUBuilder>::add_fertility_params
              (&am,&model,HIDDEN_DIM,local_660 != 0);
  }
  std::__cxx11::string::string((string *)&local_690,"initialise",(allocator *)&local_658);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)this,&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  if (sVar10 != 0) {
    std::__cxx11::string::string((string *)&local_690,"initialise",(allocator *)&local_658);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar8);
    initialise(&model,pbVar13);
    std::__cxx11::string::~string((string *)&local_690);
  }
  if (!bVar20 && sVar7 != 0) {
    dynet::AttentionalModel<dynet::GRUBuilder>::add_fertility_params
              (&am,&model,HIDDEN_DIM,local_660 != 0);
  }
  std::__cxx11::string::string((string *)&local_690,"test",(allocator *)&local_510);
  sVar10 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)this,&local_690);
  if (sVar10 == 0) {
    std::__cxx11::string::string((string *)&local_658,"kbest",&local_691);
    sVar10 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,&local_658);
    if (sVar10 != 0) {
      std::__cxx11::string::~string((string *)&local_658);
      goto LAB_001325e6;
    }
    std::__cxx11::string::string((string *)&local_568,"fert-stats",&local_692);
    sVar10 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_658);
    std::__cxx11::string::~string((string *)&local_690);
    if (sVar10 != 0) goto LAB_001325f0;
    std::__cxx11::string::string((string *)&local_70,(string *)&fname);
    std::__cxx11::string::string((string *)&local_690,"curriculum",&local_691);
    sVar10 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,&local_690);
    std::__cxx11::string::string((string *)&local_658,"epochs",&local_692);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    piVar17 = boost::any_cast<int_const&>(paVar8);
    iVar2 = *piVar17;
    std::__cxx11::string::string((string *)&local_568,"coverage",&local_661);
    paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
    pfVar14 = boost::any_cast<float_const&>(paVar8);
    local_660 = CONCAT44(local_660._4_4_,*pfVar14);
    std::__cxx11::string::string((string *)&local_510,"display",&local_662);
    sVar11 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)this,&local_510);
    train<dynet::AttentionalModel<dynet::GRUBuilder>>
              (&model,&am,&training,&devel,(Trainer *)this_00,&local_70,sVar10 != 0,iVar2,
               local_670 != 0,(float)local_660,sVar11 != 0,sVar7 != 0);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_658);
    std::__cxx11::string::~string((string *)&local_690);
    this_02 = &local_70;
  }
  else {
LAB_001325e6:
    std::__cxx11::string::~string((string *)&local_690);
LAB_001325f0:
    std::__cxx11::string::string((string *)&local_690,"kbest",(allocator *)&local_658);
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this,&local_690);
    std::__cxx11::string::~string((string *)&local_690);
    if (sVar7 == 0) {
      std::__cxx11::string::string((string *)&local_690,"test",(allocator *)&local_658);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)this,&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      if (sVar7 != 0) {
        std::__cxx11::string::string((string *)&local_690,"rescore",(allocator *)&local_658);
        sVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)this,&local_690);
        std::__cxx11::string::~string((string *)&local_690);
        if (sVar7 != 0) {
          test_rescore<dynet::AttentionalModel<dynet::GRUBuilder>>
                    (&model,&am,&testing,local_670 != 0);
          goto LAB_001326d2;
        }
        std::__cxx11::string::string((string *)&local_690,"test",(allocator *)&local_568);
        paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
        pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar8);
        std::__cxx11::string::string((string *)&local_b0,(string *)pbVar13);
        std::__cxx11::string::string((string *)&local_658,"beam",(allocator *)&local_510);
        paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
        puVar9 = boost::any_cast<unsigned_int_const&>(paVar8);
        test_decode<dynet::AttentionalModel<dynet::GRUBuilder>>
                  (&model,&am,&local_b0,local_670 != 0,*puVar9);
        std::__cxx11::string::~string((string *)&local_658);
        this_01 = &local_b0;
        goto LAB_001326c3;
      }
      std::__cxx11::string::string((string *)&local_690,"fert-stats",(allocator *)&local_658);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)this,&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      if (sVar7 == 0) goto LAB_001326d2;
      std::__cxx11::string::string((string *)&local_690,"fertility",(allocator *)&local_658);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)this,&local_690);
      fert_stats<dynet::AttentionalModel<dynet::GRUBuilder>>(&model,&am,&devel,sVar7 != 0);
    }
    else {
      std::__cxx11::string::string((string *)&local_690,"kbest",(allocator *)&local_568);
      paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar8);
      std::__cxx11::string::string((string *)&local_90,(string *)pbVar13);
      std::__cxx11::string::string((string *)&local_658,"topk",(allocator *)&local_510);
      paVar8 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)vm);
      puVar9 = boost::any_cast<unsigned_int_const&>(paVar8);
      test_kbest_arcs<dynet::AttentionalModel<dynet::GRUBuilder>>(&model,&am,&local_90,*puVar9);
      std::__cxx11::string::~string((string *)&local_658);
      this_01 = &local_90;
LAB_001326c3:
      std::__cxx11::string::~string((string *)this_01);
    }
    this_02 = &local_690;
  }
  std::__cxx11::string::~string((string *)this_02);
LAB_001326d2:
  (**(code **)(*(long *)this_00 + 8))(this_00);
  dynet::AttentionalModel<dynet::GRUBuilder>::~AttentionalModel(&am);
  dynet::Model::~Model(&model);
  std::__cxx11::string::~string((string *)&fname);
  std::__cxx11::string::~string((string *)&line);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector(&testing);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector(&devel);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector(&training);
  std::__cxx11::string::~string((string *)&flavour);
  return 0;
}

Assistant:

int main_body(variables_map vm)
{
    kSRC_SOS = sd.convert("<s>");
    kSRC_EOS = sd.convert("</s>");
    kTGT_SOS = td.convert("<s>");
    kTGT_EOS = td.convert("</s>");
    verbose = vm.count("verbose");

    LAYERS = vm["layers"].as<int>(); 
    ALIGN_DIM = vm["align"].as<int>(); 
    HIDDEN_DIM = vm["hidden"].as<int>(); 
    bool bidir = vm.count("bidirectional");
    bool giza = vm.count("giza");
    bool giza_pos = giza || vm.count("gz-position");
    bool giza_markov = giza || vm.count("gz-markov");
    bool giza_fert = giza || vm.count("gz-fertility");
    bool fert = vm.count("fertility");
    bool swap = vm.count("swap");
    bool doco = vm.count("document");
    string flavour = "RNN";
    if (vm.count("lstm"))	flavour = "LSTM";
    else if (vm.count("gru"))	flavour = "GRU";

    Corpus training, devel, testing;
    string line;
    cerr << "Reading training data from " << vm["train"].as<string>() << "...\n";
    training = read_corpus(vm["train"].as<string>(), doco);
    sd.freeze(); // no new word types allowed
    td.freeze(); // no new word types allowed
    
    SRC_VOCAB_SIZE = sd.size();
    TGT_VOCAB_SIZE = td.size();

    if (vm.count("devel")) {
	cerr << "Reading dev data from " << vm["devel"].as<string>() << "...\n";
	devel = read_corpus(vm["devel"].as<string>(), doco);
    }

    if (vm.count("test") && vm.count("rescore")) {
        // otherwise "test" file is assumed just to contain source language strings
        cerr << "Reading test examples from " << vm["test"].as<string>() << endl;
        testing = read_corpus(vm["test"].as<string>(), doco);
    }

    if (swap) {
	cerr << "Swapping role of source and target\n";
        std::swap(sd, td);
        std::swap(kSRC_SOS, kTGT_SOS);
        std::swap(kSRC_EOS, kTGT_EOS);
        std::swap(SRC_VOCAB_SIZE, TGT_VOCAB_SIZE);
        for (auto &sent: training)
            std::swap(get<0>(sent), get<1>(sent));
        for (auto &sent: devel)
            std::swap(get<0>(sent), get<1>(sent));
        for (auto &sent: testing)
            std::swap(get<0>(sent), get<1>(sent));
    }

    string fname;
    if (vm.count("parameters"))
    	fname = vm["parameters"].as<string>();
    else if (vm.count("initialise"))
    	fname = vm["initialise"].as<string>();
    else {
		ostringstream os;
		os << "am"
			<< '_' << LAYERS
			<< '_' << HIDDEN_DIM
			<< '_' << ALIGN_DIM
			<< '_' << flavour
			<< "_b" << bidir
			<< "_g" << (int)giza_pos << (int)giza_markov << (int)giza_fert
			<< "_d" << doco
			<< "-pid" << getpid() << ".params";
		fname = os.str();
	}

	cerr << "Parameters will be written to: " << fname << endl;

   Model model;
   Trainer* sgd = nullptr;
   unsigned sgd_type = vm["sgd_trainer"].as<unsigned>();
   if (sgd_type == 1)
       sgd = new MomentumSGDTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 2)
       sgd = new AdagradTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 3)
       sgd = new AdadeltaTrainer(model);
   else if (sgd_type == 4)
       sgd = new AdamTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 0)//Vanilla SGD trainer
       sgd = new SimpleSGDTrainer(model, vm["lr_eta"].as<float>());
   else
       assert("Unknown SGD trainer type! (0: vanilla SGD; 1: momentum SGD; 2: Adagrad; 3: AdaDelta; 4: Adam)");
   sgd->eta_decay = vm["lr_eta_decay"].as<float>();
   sgd->sparse_updates_enabled = vm["sparse_updates"].as<bool>();
   if (!sgd->sparse_updates_enabled)
      cerr << "Sparse updates for lookup parameter(s) to be disabled!" << endl;

   cerr << "%% Using " << flavour << " recurrent units" << endl;
   AttentionalModel<rnn_t> am(&model, SRC_VOCAB_SIZE, TGT_VOCAB_SIZE,
	    LAYERS, HIDDEN_DIM, ALIGN_DIM, bidir, giza_pos, giza_markov, giza_fert, doco, !fert);

   bool add_fer = false;
   if (vm.count("test") && vm.count("rescore"))
   {
	   am.add_fertility_params(&model, HIDDEN_DIM, bidir);
	   add_fer = true;
   }

   if (vm.count("initialise")) initialise(model, vm["initialise"].as<string>());

   if (fert && !add_fer) am.add_fertility_params(&model, HIDDEN_DIM, bidir);

   if (!vm.count("test") && !vm.count("kbest") && !vm.count("fert-stats"))
    	train(model, am, training, devel, *sgd, fname, vm.count("curriculum"),
                vm["epochs"].as<int>(), doco, vm["coverage"].as<float>(), vm.count("display"),
                fert);
    else if (vm.count("kbest"))
    	test_kbest_arcs(model, am, vm["kbest"].as<string>(), vm["topk"].as<unsigned>());
    else if (vm.count("test")) {
        if (vm.count("rescore"))
            test_rescore(model, am, testing, doco);
        else // test
            test_decode(model, am, vm["test"].as<string>(), doco, vm["beam"].as<unsigned>());
    }
    else if (vm.count("fert-stats"))
        fert_stats(model, am, devel, vm.count("fertility"));

    delete sgd;

    //dynet::Free();

    return EXIT_SUCCESS;
}